

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveTable(Parser *parser,int flags)

{
  bool bVar1;
  Token *token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source;
  undefined4 in_register_00000034;
  Parser *this;
  Encoding encoding;
  undefined1 local_80 [8];
  StringLiteral encodingName;
  vector<Expression,_std::allocator<Expression>_> list;
  StringLiteral fileName;
  
  this = (Parser *)CONCAT44(in_register_00000034,flags);
  token = Parser::peekToken(this,0);
  list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = Parser::parseExpressionList(this,&list,1,2);
  if (!bVar1) {
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    goto LAB_0016c762;
  }
  fileName._value._M_dataplus._M_p = (pointer)&fileName._value.field_2;
  fileName._value._M_string_length = 0;
  fileName._value.field_2._M_local_buf[0] = '\0';
  bVar1 = Expression::evaluateString
                    (list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                     super__Vector_impl_data._M_start,&fileName,true);
  if (bVar1) {
    source = extraout_RDX;
    if ((long)list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
              super__Vector_impl_data._M_start == 0x30) {
      encodingName._value._M_dataplus._M_p = (pointer)&encodingName._value.field_2;
      encodingName._value._M_string_length = 0;
      encodingName._value.field_2._M_local_buf[0] = '\0';
      bVar1 = Expression::evaluateString
                        (list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                         super__Vector_impl_data._M_start + 1,&encodingName,true);
      if (bVar1) {
        getEncodingFromString(&encodingName._value);
      }
      else {
        Parser::printError<>(this,token,"Invalid encoding name");
        (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      }
      std::__cxx11::string::~string((string *)&encodingName);
      source = extraout_RDX_00;
      if (!bVar1) goto LAB_0016c758;
    }
    ghc::filesystem::u8path<std::__cxx11::string,ghc::filesystem::path>
              ((path *)&encodingName,(filesystem *)&fileName,source);
    std::make_unique<TableCommand,ghc::filesystem::path,TextFile::Encoding&>
              ((path *)local_80,(Encoding *)&encodingName);
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_80;
    local_80 = (undefined1  [8])0x0;
    ghc::filesystem::path::~path((path *)&encodingName);
  }
  else {
    Parser::printError<>(this,token,"Invalid file name");
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
LAB_0016c758:
  std::__cxx11::string::~string((string *)&fileName);
LAB_0016c762:
  std::vector<Expression,_std::allocator<Expression>_>::~vector(&list);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveTable(Parser& parser, int flags)
{
	const Token& start = parser.peekToken();

	std::vector<Expression> list;
	if (!parser.parseExpressionList(list,1,2))
		return nullptr;

	StringLiteral fileName;
	if (!list[0].evaluateString(fileName,true))
	{
		parser.printError(start, "Invalid file name");
		return nullptr;
	}

	TextFile::Encoding encoding = TextFile::GUESS;
	if (list.size() == 2)
	{
		StringLiteral encodingName;
		if (!list[1].evaluateString(encodingName,true))
		{
			parser.printError(start, "Invalid encoding name");
			return nullptr;
		}

		encoding = getEncodingFromString(encodingName.string());
	}

	return std::make_unique<TableCommand>(fileName.path(),encoding);
}